

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

double benchmark_processing<eumorphic::collection<container,A,B,C,D,CA,CB>>(size_t num_elems)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  collection<container,_A,_B,_C,_D,_CA,_CB> container;
  uniform_int_distribution<int> rnd_type;
  mt19937_64 gen;
  random_device rd;
  anon_class_1_0_00000001 local_1e81;
  double local_1e80;
  anon_class_8_1_54a39806 local_1e78;
  pointer local_1e70;
  long local_1e68;
  pointer local_1e60;
  pointer local_1e58;
  pointer local_1e50;
  pointer local_1e48;
  pointer local_1e40;
  on_each<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_nasosi[P]eumorphic_lib_eumorphic_include_eumorphic_hpp:86:29)_*>
  local_1e38;
  collection<container,_A,_B,_C,_D,_CA,_CB> local_1e30;
  param_type local_1da0;
  uniform_real_distribution<double> local_1d98;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_1d80;
  random_device local_13b8;
  
  memset(&local_1e30,0,0x90);
  std::random_device::random_device(&local_13b8);
  uVar1 = std::random_device::_M_getval();
  local_1d80._M_x[0] = (unsigned_long)uVar1;
  lVar2 = 1;
  uVar3 = local_1d80._M_x[0];
  do {
    uVar3 = (uVar3 >> 0x3e ^ uVar3) * 0x5851f42d4c957f2d + lVar2;
    local_1d80._M_x[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x138);
  local_1d80._M_p = 0x138;
  local_1da0._M_a = 0;
  local_1da0._M_b = 5;
  local_1d98._M_param._M_a = 0.0;
  local_1d98._M_param._M_b = 100000.0;
  random_fill<eumorphic::collection<container,A,B,C,D,CA,CB>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_int_distribution<int>,std::uniform_real_distribution<double>>
            (&local_1e30,&local_1d80,(uniform_int_distribution<int> *)&local_1da0,&local_1d98,
             num_elems);
  local_1e80 = (double)std::chrono::_V2::system_clock::now();
  local_1e78.f = &local_1e81;
  local_1e38.f = &local_1e78;
  boost::hana::detail::
  on_each<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/nasosi[P]eumorphic/lib/eumorphic/include/eumorphic.hpp:86:29)_*>
  ::
  operator()<std::vector<A,_std::allocator<A>_>_&,_std::vector<B,_std::allocator<B>_>_&,_std::vector<C,_std::allocator<C>_>_&,_std::vector<D,_std::allocator<D>_>_&,_std::vector<CA,_std::allocator<CA>_>_&,_std::vector<CB,_std::allocator<CB>_>_&>
            (&local_1e38,(vector<A,_std::allocator<A>_> *)&local_1e30,
             &local_1e30.data_.storage_.
              super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
              .super_ebo<boost::hana::detail::bti<1UL>,_std::vector<B,_std::allocator<B>_>,_false>.
              data_,&local_1e30.data_.storage_.
                     super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
                     .
                     super_ebo<boost::hana::detail::bti<2UL>,_std::vector<C,_std::allocator<C>_>,_false>
                     .data_,
             &local_1e30.data_.storage_.
              super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
              .super_ebo<boost::hana::detail::bti<3UL>,_std::vector<D,_std::allocator<D>_>,_false>.
              data_,&local_1e30.data_.storage_.
                     super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
                     .
                     super_ebo<boost::hana::detail::bti<4UL>,_std::vector<CA,_std::allocator<CA>_>,_false>
                     .data_,
             &local_1e30.data_.storage_.
              super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
              .super_ebo<boost::hana::detail::bti<5UL>,_std::vector<CB,_std::allocator<CB>_>,_false>
              .data_);
  local_1e68 = std::chrono::_V2::system_clock::now();
  local_1e40 = local_1e30.data_.storage_.
               super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
               .super_ebo<boost::hana::detail::bti<0UL>,_std::vector<A,_std::allocator<A>_>,_false>.
               data_.super__Vector_base<A,_std::allocator<A>_>._M_impl.super__Vector_impl_data.
               _M_start;
  local_1e48 = local_1e30.data_.storage_.
               super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
               .super_ebo<boost::hana::detail::bti<1UL>,_std::vector<B,_std::allocator<B>_>,_false>.
               data_.super__Vector_base<B,_std::allocator<B>_>._M_impl.super__Vector_impl_data.
               _M_start;
  local_1e50 = local_1e30.data_.storage_.
               super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
               .super_ebo<boost::hana::detail::bti<2UL>,_std::vector<C,_std::allocator<C>_>,_false>.
               data_.super__Vector_base<C,_std::allocator<C>_>._M_impl.super__Vector_impl_data.
               _M_start;
  local_1e58 = local_1e30.data_.storage_.
               super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
               .super_ebo<boost::hana::detail::bti<3UL>,_std::vector<D,_std::allocator<D>_>,_false>.
               data_.super__Vector_base<D,_std::allocator<D>_>._M_impl.super__Vector_impl_data.
               _M_start;
  local_1e60 = local_1e30.data_.storage_.
               super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
               .
               super_ebo<boost::hana::detail::bti<4UL>,_std::vector<CA,_std::allocator<CA>_>,_false>
               .data_.super__Vector_base<CA,_std::allocator<CA>_>._M_impl.super__Vector_impl_data.
               _M_start;
  local_1e78.f = &local_1e81;
  local_1e38.f = &local_1e78;
  local_1e70 = local_1e30.data_.storage_.
               super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
               .
               super_ebo<boost::hana::detail::bti<5UL>,_std::vector<CB,_std::allocator<CB>_>,_false>
               .data_.super__Vector_base<CB,_std::allocator<CB>_>._M_impl.super__Vector_impl_data.
               _M_start;
  boost::hana::detail::
  on_each<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/nasosi[P]eumorphic/lib/eumorphic/include/eumorphic.hpp:86:29)_*>
  ::
  operator()<std::vector<A,_std::allocator<A>_>_&,_std::vector<B,_std::allocator<B>_>_&,_std::vector<C,_std::allocator<C>_>_&,_std::vector<D,_std::allocator<D>_>_&,_std::vector<CA,_std::allocator<CA>_>_&,_std::vector<CB,_std::allocator<CB>_>_&>
            (&local_1e38,(vector<A,_std::allocator<A>_> *)&local_1e30,
             &local_1e30.data_.storage_.
              super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
              .super_ebo<boost::hana::detail::bti<1UL>,_std::vector<B,_std::allocator<B>_>,_false>.
              data_,&local_1e30.data_.storage_.
                     super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
                     .
                     super_ebo<boost::hana::detail::bti<2UL>,_std::vector<C,_std::allocator<C>_>,_false>
                     .data_,
             &local_1e30.data_.storage_.
              super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
              .super_ebo<boost::hana::detail::bti<3UL>,_std::vector<D,_std::allocator<D>_>,_false>.
              data_,&local_1e30.data_.storage_.
                     super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
                     .
                     super_ebo<boost::hana::detail::bti<4UL>,_std::vector<CA,_std::allocator<CA>_>,_false>
                     .data_,
             &local_1e30.data_.storage_.
              super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
              .super_ebo<boost::hana::detail::bti<5UL>,_std::vector<CB,_std::allocator<CB>_>,_false>
              .data_);
  std::random_device::_M_fini();
  lVar2 = ((long)local_1e30.data_.storage_.
                 super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
                 .
                 super_ebo<boost::hana::detail::bti<0UL>,_std::vector<A,_std::allocator<A>_>,_false>
                 .data_.super__Vector_base<A,_std::allocator<A>_>._M_impl.super__Vector_impl_data.
                 _M_finish - (long)local_1e40 >> 4) +
          ((long)local_1e30.data_.storage_.
                 super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
                 .
                 super_ebo<boost::hana::detail::bti<1UL>,_std::vector<B,_std::allocator<B>_>,_false>
                 .data_.super__Vector_base<B,_std::allocator<B>_>._M_impl.super__Vector_impl_data.
                 _M_finish - (long)local_1e48 >> 4) +
          ((long)local_1e30.data_.storage_.
                 super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
                 .
                 super_ebo<boost::hana::detail::bti<2UL>,_std::vector<C,_std::allocator<C>_>,_false>
                 .data_.super__Vector_base<C,_std::allocator<C>_>._M_impl.super__Vector_impl_data.
                 _M_finish - (long)local_1e50 >> 4) +
          ((long)local_1e30.data_.storage_.
                 super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
                 .
                 super_ebo<boost::hana::detail::bti<4UL>,_std::vector<CA,_std::allocator<CA>_>,_false>
                 .data_.super__Vector_base<CA,_std::allocator<CA>_>._M_impl.super__Vector_impl_data.
                 _M_finish - (long)local_1e60 >> 4) +
          ((long)local_1e30.data_.storage_.
                 super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
                 .
                 super_ebo<boost::hana::detail::bti<3UL>,_std::vector<D,_std::allocator<D>_>,_false>
                 .data_.super__Vector_base<D,_std::allocator<D>_>._M_impl.super__Vector_impl_data.
                 _M_finish - (long)local_1e58 >> 3) * 0x6db6db6db6db6db7 +
          ((long)local_1e30.data_.storage_.
                 super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
                 .
                 super_ebo<boost::hana::detail::bti<5UL>,_std::vector<CB,_std::allocator<CB>_>,_false>
                 .data_.super__Vector_base<CB,_std::allocator<CB>_>._M_impl.super__Vector_impl_data.
                 _M_finish - (long)local_1e70 >> 5) * -0x5555555555555555;
  auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar4._0_8_ = lVar2;
  auVar4._12_4_ = 0x45300000;
  local_1e80 = ((double)(local_1e68 - (long)local_1e80) / 1000000000.0) /
               ((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
  std::vector<CB,_std::allocator<CB>_>::~vector
            (&local_1e30.data_.storage_.
              super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
              .super_ebo<boost::hana::detail::bti<5UL>,_std::vector<CB,_std::allocator<CB>_>,_false>
              .data_);
  std::vector<CA,_std::allocator<CA>_>::~vector
            (&local_1e30.data_.storage_.
              super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
              .super_ebo<boost::hana::detail::bti<4UL>,_std::vector<CA,_std::allocator<CA>_>,_false>
              .data_);
  std::vector<D,_std::allocator<D>_>::~vector
            (&local_1e30.data_.storage_.
              super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
              .super_ebo<boost::hana::detail::bti<3UL>,_std::vector<D,_std::allocator<D>_>,_false>.
              data_);
  std::vector<C,_std::allocator<C>_>::~vector
            (&local_1e30.data_.storage_.
              super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
              .super_ebo<boost::hana::detail::bti<2UL>,_std::vector<C,_std::allocator<C>_>,_false>.
              data_);
  std::vector<B,_std::allocator<B>_>::~vector
            (&local_1e30.data_.storage_.
              super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>,_std::vector<A,_std::allocator<A>_>,_std::vector<B,_std::allocator<B>_>,_std::vector<C,_std::allocator<C>_>,_std::vector<D,_std::allocator<D>_>,_std::vector<CA,_std::allocator<CA>_>,_std::vector<CB,_std::allocator<CB>_>_>
              .super_ebo<boost::hana::detail::bti<1UL>,_std::vector<B,_std::allocator<B>_>,_false>.
              data_);
  std::vector<A,_std::allocator<A>_>::~vector((vector<A,_std::allocator<A>_> *)&local_1e30);
  return local_1e80;
}

Assistant:

double benchmark_processing( std::size_t num_elems)
{
	Cont container;

        //std::cout << "p";
        std::random_device rd;
        std::mt19937_64					gen(rd());
	std::uniform_int_distribution<>			rnd_type(0, 5 );
	std::uniform_real_distribution<double>	rnd_value(0, 100000);
	random_fill(container, gen, rnd_type, rnd_value, num_elems);

	auto start = tic();
	{
		process(container);
	}
	double t = toc(start);
	double duration = t / container.size();
	do_not_optimize_out(container);

	return duration;
}